

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_pairing.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
::_update_barcode(RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
                  *this,ID_index birthPivot,Pos_index death)

{
  uint *__args;
  ulong uVar1;
  __node_base_ptr p_Var2;
  iterator __position;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->idToPosition_)._M_h._M_bucket_count;
  uVar4 = (ulong)birthPivot % uVar1;
  p_Var2 = (this->idToPosition_)._M_h._M_buckets[uVar4];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var2 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var2->_M_nxt, p_Var5 = p_Var2, *(ID_index *)&p_Var6[1]._M_nxt != birthPivot)) {
    while (p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var5 = p_Var6, p_Var6 = p_Var3, *(uint *)&p_Var3[1]._M_nxt == birthPivot))
      goto LAB_00111a25;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00111a25:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var5->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    birthPivot = *(uint *)((long)&p_Var3[1]._M_nxt + 4);
  }
  __args = (this->indexToBar_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + birthPivot;
  (this->barcode_).
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[*__args].death = death;
  __position._M_current =
       (this->indexToBar_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->indexToBar_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->indexToBar_,__position,
               __args);
    return;
  }
  *__position._M_current = *__args;
  (this->indexToBar_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = __position._M_current + 1;
  return;
}

Assistant:

void _update_barcode(ID_index birthPivot, Pos_index death) {
    auto it = idToPosition_.find(birthPivot);
    Pos_index pivotBirth = it == idToPosition_.end() ? birthPivot : it->second;
    if constexpr (Master_matrix::hasFixedBarcode || !Master_matrix::Option_list::has_removable_columns) {
      barcode_[indexToBar_[pivotBirth]].death = death;
      indexToBar_.push_back(indexToBar_[pivotBirth]);
    } else {
      auto& barIt = indexToBar_.at(pivotBirth);
      barIt->death = death;
      indexToBar_.try_emplace(death, barIt);  // list so iterators are stable
    }
  }